

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O1

void __thiscall toml::detail::location::reset(location *this,const_iterator rollback)

{
  char *pcVar1;
  long lVar2;
  const_iterator cVar3;
  
  pcVar1 = (this->iter_)._M_current;
  if ((long)pcVar1 - (long)rollback._M_current < 0) {
    if (pcVar1 == rollback._M_current) {
      lVar2 = 0;
    }
    else {
      lVar2 = 0;
      do {
        lVar2 = lVar2 + (ulong)(*pcVar1 == '\n');
        pcVar1 = pcVar1 + 1;
      } while (pcVar1 != rollback._M_current);
    }
    this->line_number_ = this->line_number_ + lVar2;
  }
  else {
    if (pcVar1 == rollback._M_current) {
      lVar2 = 0;
    }
    else {
      lVar2 = 0;
      cVar3._M_current = rollback._M_current;
      do {
        lVar2 = lVar2 + (ulong)(*cVar3._M_current == '\n');
        cVar3._M_current = cVar3._M_current + 1;
      } while (cVar3._M_current != pcVar1);
    }
    this->line_number_ = this->line_number_ - lVar2;
  }
  (this->iter_)._M_current = rollback._M_current;
  return;
}

Assistant:

void reset(const_iterator rollback) noexcept
    {
        // since c++11, std::distance works in both ways for random-access
        // iterators and returns a negative value if `first > last`.
        if(0 <= std::distance(rollback, this->iter_)) // rollback < iter
        {
            this->line_number_ -= static_cast<std::size_t>(
                    std::count(rollback, this->iter_, '\n'));
        }
        else // iter < rollback [[unlikely]]
        {
            this->line_number_ += static_cast<std::size_t>(
                    std::count(this->iter_, rollback, '\n'));
        }
        this->iter_ = rollback;
        return;
    }